

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O1

void __thiscall
ExchangePaths_RoundTripForTwoPaths_Test::TestBody(ExchangePaths_RoundTripForTwoPaths_Test *this)

{
  typed_address<pstore::indirect_string> tVar1;
  undefined1 uVar2;
  uint generation;
  string *psVar3;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  typed_address<pstore::indirect_string> *ptVar6;
  _List_node_base *p_Var7;
  database *pdVar8;
  undefined1 __ptr_00 [8];
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  string_mapping *string_table;
  pointer *__ptr;
  char *pcVar9;
  error_code eVar10;
  raw_sstring_view rVar11;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out_00;
  array<const_char_*,_2UL> paths;
  shared_sstring_view owner;
  AssertionResult gtest_ar_;
  mock_mutex mutex;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  string_mapping imported_names;
  ostringstream exported_names_stream;
  undefined1 local_268 [8];
  char *pcStack_260;
  bool local_258 [16];
  string local_248;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_220;
  undefined1 local_218 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  undefined1 local_201;
  undefined1 local_200 [8];
  undefined1 local_1f8 [8];
  __node_base local_1f0;
  _List_node_base *p_Stack_1e8;
  float local_1e0;
  _Elt_pointer local_1d8;
  __node_base_ptr ap_Stack_1d0 [5];
  int local_1a8;
  error_category *local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  AssertHelper local_158;
  undefined1 local_150 [40];
  _Head_base<0UL,_pstore::region::factory_*,_false> local_128;
  bool local_120;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_118;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_110;
  undefined1 local_108 [56];
  mutex_type *local_d0;
  size_t local_c8;
  typed_address<pstore::trailer> local_c0;
  size_type local_b8;
  __node_base local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a8;
  float local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __node_base_ptr ap_Stack_90 [2];
  ostringstream local_80;
  
  pstore::exchange::export_ns::ostream_base::ostream_base(&local_80.super_ostream_base,0x1000);
  local_80.super_ostream_base._vptr_ostream_base = (_func_int **)&PTR__ostringstream_00243498;
  local_80.str_._M_dataplus._M_p = (pointer)&local_80.str_.field_2;
  local_80.str_._M_string_length = 0;
  local_80.str_.field_2._M_local_buf[0] = '\0';
  local_268 = (undefined1  [8])0x1e84f7;
  pcStack_260 = "path2";
  local_200 = (undefined1  [8])ap_Stack_1d0;
  local_1f8 = (undefined1  [8])0x1;
  local_1f0._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_1e8 = (_List_node_base *)0x0;
  local_1e0 = 1.0;
  local_1d8 = (_Elt_pointer)0x0;
  ap_Stack_1d0[0] = (__node_base_ptr)0x0;
  pdVar8 = &(this->super_ExchangePaths).export_db_;
  out_00.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out_00.container =
       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
        *)local_200;
  add_export_strings<(pstore::trailer::indices)4,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar8,(char **)local_268,(char **)local_258,out_00);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)4>
            ((string_mapping *)local_108,pdVar8);
  generation = pstore::database::get_current_revision(pdVar8);
  pcVar9 = "";
  local_150._0_8_ = local_150 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"","");
  string_table = (string_mapping *)local_108;
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)4>
            (&local_80.super_ostream_base,(indent)0x0,pdVar8,generation,(string *)local_150,
             string_table,false);
  if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
    operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
  }
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_108);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_200);
  local_108._16_8_ = (_Hash_node_base *)0x0;
  local_108._0_8_ = (element_type *)0x0;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108._24_8_ = local_108 + 0x18;
  local_108._40_8_ = 0;
  local_108._48_8_ = local_108 + 0x30;
  local_c8 = 0;
  local_c0.a_.a_ = (address)((long)local_108 + 0x78);
  local_b8 = 1;
  local_b0._M_nxt = (_Hash_node_base *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_a0 = 1.0;
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ap_Stack_90[0] = (__node_base_ptr)0x0;
  local_200 = (undefined1  [8])&local_201;
  local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffffffffff00);
  local_108._32_8_ = local_108._24_8_;
  local_d0 = (mutex_type *)local_108._48_8_;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_200);
  pdVar8 = &(this->super_ExchangePaths).import_db_;
  local_1f8[0] = 1;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_150,pdVar8,(lock_type *)local_200);
  if (((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )local_1f8[0] ==
       (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )0x1) && ((type)local_200 != (type)0x0)) {
    local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffffffffff00);
  }
  anon_unknown.dwarf_39da45::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_200,(transaction *)local_150,
             (string_mapping *)local_108);
  psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_80);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)local_200,psVar3);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  local_218[0] = local_1a8 == 0;
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1a8 != 0) {
    testing::Message::Message((Message *)&local_220);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_220._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_1a0 + 0x20))(local_268,local_1a0,local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_220._M_head_impl + 0x10),(char *)local_268,(long)pcStack_260);
    local_248._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_220._M_head_impl + 0x10),(char *)&local_248,1);
    local_248._M_dataplus._M_p._0_1_ = 0x28;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_220._M_head_impl + 0x10),(char *)&local_248,1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    local_248._M_dataplus._M_p._0_1_ = 0x3a;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_248,1);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    local_248._M_dataplus._M_p._0_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_248,1);
    local_248._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_220._M_head_impl + 0x10),(char *)&local_248,1);
    psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_80);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_220._M_head_impl + 0x10),(psVar3->_M_dataplus)._M_p,
               psVar3->_M_string_length);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_248,(internal *)local_218,(AssertionResult *)"name_parser.has_error ()","true"
               ,"false",(char *)string_table);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x96,local_248._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (local_268 != (undefined1  [8])local_258) {
      operator_delete((void *)local_268,CONCAT71(local_258._1_7_,local_258[0]) + 1);
    }
    if (local_220._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_220._M_head_impl + 8))();
    }
    if (local_210 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_210,local_210);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_p != &local_170) {
      operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
    }
    if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)local_1f8);
    if ((type)local_200 != (type)0x0) {
      operator_delete((void *)local_200,0x68);
    }
    local_150._0_8_ = &PTR__transaction_0023bdb8;
    pstore::transaction_base::rollback((transaction_base *)local_150);
    if ((local_120 == true) &&
       ((_Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>)
        local_128._M_head_impl != (factory *)0x0)) {
      local_120 = false;
    }
    goto LAB_0017a672;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
  }
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
            *)local_1f8);
  if ((type)local_200 != (type)0x0) {
    operator_delete((void *)local_200,0x68);
  }
  pstore::transaction_base::commit((transaction_base *)local_150);
  local_150._0_8_ = &PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback((transaction_base *)local_150);
  if ((local_120 == true) &&
     ((_Head_base<0UL,_pstore::region::factory_*,_false>)local_128._M_head_impl !=
      (_Head_base<0UL,_pstore::region::factory_*,_false>)0x0)) {
    local_120 = false;
  }
  local_150._16_8_ = 0;
  local_150._0_8_ = local_150;
  local_150._8_8_ = local_150;
  local_268 = (undefined1  [8])
              pstore::exchange::import_ns::string_mapping::size((string_mapping *)local_108);
  local_248._M_dataplus._M_p._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)local_200,"imported_names.size ()","2U",(unsigned_long *)local_268,
             (uint *)&local_248);
  if ((internal)local_200[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_268);
    if (local_1f8 != (undefined1  [8])0x0) {
      pcVar9 = *(char **)local_1f8;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0xa0,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_248,(Message *)local_268);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
    if ((type)local_268 != (type)0x0) {
      (**(code **)(*(char **)local_268 + 8))();
    }
    if (local_1f8 != (undefined1  [8])0x0) {
      this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1f8;
      __ptr_00 = local_1f8;
LAB_0017a19e:
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           __ptr_00);
    }
  }
  else {
    if (local_1f8 != (undefined1  [8])0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
    }
    pstore::exchange::import_ns::string_mapping::lookup
              ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268,
               (string_mapping *)local_108,0);
    eVar10 = pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::get_error
                       ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
    local_248._M_string_length = (size_type)eVar10._M_cat;
    local_248._M_dataplus._M_p._0_4_ = eVar10._M_value;
    local_218._0_4_ = 0;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::_V2::system_category();
    local_210 = pbVar5;
    testing::internal::CmpHelperEQ<std::error_code,std::error_code>
              ((internal *)local_200,"str_addr_or_err.get_error ()","std::error_code{}",
               (error_code *)&local_248,(error_code *)local_218);
    uVar2 = local_200[0];
    if ((internal)local_200[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_248);
      if (local_1f8 == (undefined1  [8])0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)local_1f8;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_218,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                 ,0xa4,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_218,(Message *)&local_248);
LAB_0017a1f5:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_218);
      if ((long *)local_248._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_248._M_dataplus._M_p + 8))();
      }
      if (local_1f8 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
        ;
      }
      if (local_258[0] == false) {
        pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
        value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,pstore::typed_address<pstore::indirect_string>>
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
      }
      else {
        pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
        error_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,std::error_code>
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
      }
    }
    else {
      if (local_1f8 != (undefined1  [8])0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8)
        ;
      }
      local_248._M_dataplus._M_p = (pointer)0x0;
      local_248._M_string_length = 0;
      local_248.field_2._M_allocated_capacity = 0;
      ptVar6 = pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
               value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>const&,pstore::typed_address<pstore::indirect_string>const>
                         ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
      tVar1.a_.a_ = (address)(ptVar6->a_).a_;
      local_110.ptr_ = (sstring_view<std::shared_ptr<const_char>_> *)&local_248;
      pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant
                (&local_110);
      rVar11 = pstore::get_sstring_view(pdVar8,tVar1,local_110);
      local_200 = (undefined1  [8])&local_1f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_200,rVar11.ptr_,rVar11.ptr_ + rVar11.size_);
      p_Var7 = (_List_node_base *)operator_new(0x30);
      p_Var7[1]._M_next = p_Var7 + 2;
      if (local_200 == (undefined1  [8])&local_1f0) {
        p_Var7[2]._M_next = (_List_node_base *)local_1f0._M_nxt;
        p_Var7[2]._M_prev = p_Stack_1e8;
      }
      else {
        *(undefined1 (*) [8])((type *)(p_Var7 + 1))->__data = local_200;
        p_Var7[2]._M_next = (_List_node_base *)local_1f0._M_nxt;
      }
      p_Var7[1]._M_prev = (_List_node_base *)local_1f8;
      local_1f8 = (undefined1  [8])0x0;
      local_1f0._M_nxt = local_1f0._M_nxt & 0xffffffffffffff00;
      local_200 = (undefined1  [8])&local_1f0;
      std::__detail::_List_node_base::_M_hook(p_Var7);
      local_150._16_8_ = local_150._16_8_ + 1;
      if (local_200 != (undefined1  [8])&local_1f0) {
        operator_delete((void *)local_200,(ulong)((long)&(local_1f0._M_nxt)->_M_nxt + 1));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length);
      }
      if (local_258[0] == false) {
        pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
        value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,pstore::typed_address<pstore::indirect_string>>
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
      }
      else {
        pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
        error_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,std::error_code>
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
      }
      if ((internal)uVar2 != (internal)0x0) {
        pstore::exchange::import_ns::string_mapping::lookup
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268,
                   (string_mapping *)local_108,1);
        eVar10 = pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::get_error
                           ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
        local_248._M_string_length = (size_type)eVar10._M_cat;
        local_248._M_dataplus._M_p._0_4_ = eVar10._M_value;
        local_218._0_4_ = 0;
        local_210 = pbVar5;
        testing::internal::CmpHelperEQ<std::error_code,std::error_code>
                  ((internal *)local_200,"str_addr_or_err.get_error ()","std::error_code{}",
                   (error_code *)&local_248,(error_code *)local_218);
        uVar2 = local_200[0];
        if ((internal)local_200[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_248);
          if (local_1f8 == (undefined1  [8])0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)local_1f8;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_218,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                     ,0xaa,pcVar9);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)local_218,(Message *)&local_248);
          goto LAB_0017a1f5;
        }
        if (local_1f8 != (undefined1  [8])0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
        }
        local_248._M_dataplus._M_p = (pointer)0x0;
        local_248._M_string_length = 0;
        local_248.field_2._M_allocated_capacity = 0;
        ptVar6 = pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
                 value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>const&,pstore::typed_address<pstore::indirect_string>const>
                           ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
        tVar1.a_.a_ = (address)(ptVar6->a_).a_;
        local_118.ptr_ = (sstring_view<std::shared_ptr<const_char>_> *)&local_248;
        pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::
        ensure_invariant(&local_118);
        rVar11 = pstore::get_sstring_view(pdVar8,tVar1,local_118);
        local_200 = (undefined1  [8])&local_1f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_200,rVar11.ptr_,rVar11.ptr_ + rVar11.size_);
        p_Var7 = (_List_node_base *)operator_new(0x30);
        p_Var7[1]._M_next = p_Var7 + 2;
        if (local_200 == (undefined1  [8])&local_1f0) {
          p_Var7[2]._M_next = (_List_node_base *)local_1f0._M_nxt;
          p_Var7[2]._M_prev = p_Stack_1e8;
        }
        else {
          *(undefined1 (*) [8])((type *)(p_Var7 + 1))->__data = local_200;
          p_Var7[2]._M_next = (_List_node_base *)local_1f0._M_nxt;
        }
        p_Var7[1]._M_prev = (_List_node_base *)local_1f8;
        local_1f8 = (undefined1  [8])0x0;
        local_1f0._M_nxt = local_1f0._M_nxt & 0xffffffffffffff00;
        local_200 = (undefined1  [8])&local_1f0;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        local_150._16_8_ = local_150._16_8_ + 1;
        if (local_200 != (undefined1  [8])&local_1f0) {
          operator_delete((void *)local_200,(ulong)((long)&(local_1f0._M_nxt)->_M_nxt + 1));
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248._M_string_length);
        }
        if (local_258[0] == false) {
          pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
          value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,pstore::typed_address<pstore::indirect_string>>
                    ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
        }
        else {
          pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
          error_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,std::error_code>
                    ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_268);
        }
        if ((internal)uVar2 != (internal)0x0) {
          local_268 = (undefined1  [8])0x1e84fd;
          pcStack_260 = "path1";
          testing::internal::
          PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
          ::operator()(local_200,local_268,
                       (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x1f2123);
          if ((internal)local_200[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_268);
            if (local_1f8 == (undefined1  [8])0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)local_1f8;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_248,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                       ,0xaf,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_248,(Message *)local_268);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
            if ((type)local_268 != (type)0x0) {
              (**(code **)(*(char **)local_268 + 8))();
            }
          }
          if (local_1f8 != (undefined1  [8])0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_1f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8);
          }
          pstore::exchange::import_ns::string_mapping::lookup
                    ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_200,
                     (string_mapping *)local_108,2);
          local_248._M_dataplus._M_p._0_4_ = 4;
          testing::internal::
          CmpHelperEQ<pstore::error_or<pstore::typed_address<pstore::indirect_string>>,pstore::exchange::import_ns::error>
                    ((internal *)local_268,"imported_names.lookup (2U)",
                     "pstore::exchange::import_ns::error::no_such_name",
                     (error_or<pstore::typed_address<pstore::indirect_string>_> *)local_200,
                     (error *)&local_248);
          if (local_1f0._M_nxt._0_1_ == false) {
            pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
            value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,pstore::typed_address<pstore::indirect_string>>
                      ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_200);
          }
          else {
            pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
            error_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,std::error_code>
                      ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_200);
          }
          if (local_268[0] == '\0') {
            testing::Message::Message((Message *)local_200);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_260 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)pcStack_260;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_248,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                       ,0xb0,pcVar9);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_248,(Message *)local_200);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_248);
            if ((type)local_200 != (type)0x0) {
              (*(code *)(*(_Hash_node_base **)local_200)[1]._M_nxt)();
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcStack_260 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            this_01 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&pcStack_260;
            __ptr_00 = (undefined1  [8])pcStack_260;
            goto LAB_0017a19e;
          }
        }
      }
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_150);
LAB_0017a672:
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_108);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_80);
  return;
}

Assistant:

TEST_F (ExchangePaths, RoundTripForTwoPaths) {
    // The output from the export phase.
    static constexpr auto comments = false;
    pstore::exchange::export_ns::ostringstream exported_names_stream;

    // The export phase. We put two strings into the paths index and export it.
    {
        std::array<pstore::gsl::czstring, 2> paths{{"path1", "path2"}};
        std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>>
            indir_strings;
        add_export_strings<pstore::trailer::indices::path> (
            export_db_, std::begin (paths), std::end (paths),
            std::inserter (indir_strings, std::end (indir_strings)));

        // Write the paths that we just created as JSON.
        pstore::exchange::export_ns::string_mapping exported_names{
            export_db_, pstore::exchange::export_ns::path_index_tag ()};
        pstore::exchange::export_ns::emit_strings<pstore::trailer::indices::path> (
            exported_names_stream, pstore::exchange::export_ns::indent{}, export_db_,
            export_db_.get_current_revision (), "", &exported_names, comments);
    }

    // The output from the import phase: the mapping from path index to address.
    pstore::exchange::import_ns::string_mapping imported_names;

    // The import phase. Read the JSON produced by the export phase and populate a database
    // accordingly.
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            auto name_parser = import_strings_parser (&transaction, &imported_names);
            name_parser.input (exported_names_stream.str ()).eof ();
            ASSERT_FALSE (name_parser.has_error ())
                << "JSON error was: " << name_parser.last_error ().message () << ' '
                << name_parser.coordinate () << '\n'
                << exported_names_stream.str ();
        }
        transaction.commit ();
    }

    // Now verify the result of the import phase.
    std::list<std::string> out;
    ASSERT_EQ (imported_names.size (), 2U);

    {
        auto const str_addr_or_err = imported_names.lookup (0U);
        ASSERT_EQ (str_addr_or_err.get_error (), std::error_code{});
        pstore::shared_sstring_view owner;
        out.push_back (get_sstring_view (import_db_, *str_addr_or_err, &owner).to_string ());
    }
    {
        auto const str_addr_or_err = imported_names.lookup (1U);
        ASSERT_EQ (str_addr_or_err.get_error (), std::error_code{});
        pstore::shared_sstring_view owner;
        out.push_back (get_sstring_view (import_db_, *str_addr_or_err, &owner).to_string ());
    }

    EXPECT_THAT (out, testing::UnorderedElementsAre ("path1", "path2"));
    EXPECT_EQ (imported_names.lookup (2U), pstore::exchange::import_ns::error::no_such_name);
}